

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O3

void __thiscall
JsUtil::
List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
::Item(List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
       *this,int index,RecyclerWeakReference<Js::ScriptFunctionType> **item)

{
  WriteBarrierPtr<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_> *addr;
  RecyclerWeakReference<Js::ScriptFunctionType> *pRVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if ((index < 0) ||
     ((this->
      super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
      ).count <= index)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/List.h"
                       ,0x167,"(index >= 0 && index < this->count)",
                       "index >= 0 && index < this->count");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pRVar1 = *item;
  addr = (this->
         super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
         ).buffer.ptr + index;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = pRVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

void Item(int index, const T& item)
        {
            Assert(index >= 0 && index < this->count);
            this->buffer[index] = item;
        }